

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::addAttachmentTestCasesWithFunctions(TestCaseGroup *group)

{
  char *__s;
  CaseDef_conflict1 *extraout_RDX;
  CaseDef_conflict1 *caseDef_00;
  CaseDef_conflict1 *extraout_RDX_00;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  CaseDef_conflict1 local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  int local_49c;
  undefined1 local_498 [4];
  int sizeNdx;
  CaseDef_conflict1 caseDef [32];
  TestCaseGroup *group_local;
  
  local_498 = (undefined1  [4])0x0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sizeNdx,0x20,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0].renderSize.m_data + 1),0x40,1,1);
  caseDef[0].attachmentSize.m_data[1] = 1;
  caseDef[0].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0].numLayers = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0].multisample,0x20,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[1].renderSize.m_data + 1),0x30,1,1);
  caseDef[1].attachmentSize.m_data[1] = 1;
  caseDef[1].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[1].numLayers = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[1].multisample,0x20,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[2].renderSize.m_data + 1),0x27,1,1);
  caseDef[2].attachmentSize.m_data[1] = 1;
  caseDef[2].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[2].numLayers = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[2].multisample,0x13,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[3].renderSize.m_data + 1),0x20,1,1);
  caseDef[3].attachmentSize.m_data[1] = 1;
  caseDef[3].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[3].numLayers = 4;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[3].multisample,0x20,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[4].renderSize.m_data + 1),0x40,1,1);
  caseDef[4].attachmentSize.m_data[1] = 4;
  caseDef[4].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[4].numLayers = 4;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[4].multisample,0x20,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[5].renderSize.m_data + 1),0x30,1,1);
  caseDef[5].attachmentSize.m_data[1] = 4;
  caseDef[5].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[5].numLayers = 4;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[5].multisample,0x20,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[6].renderSize.m_data + 1),0x27,1,1);
  caseDef[6].attachmentSize.m_data[1] = 4;
  caseDef[6].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[6].numLayers = 4;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[6].multisample,0x13,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[7].renderSize.m_data + 1),0x20,1,1);
  caseDef[7].attachmentSize.m_data[1] = 4;
  caseDef[7].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[7].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[7].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[8].renderSize.m_data + 1),0x40,0x40,1);
  caseDef[8].attachmentSize.m_data[1] = 1;
  caseDef[8].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[8].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[8].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[9].renderSize.m_data + 1),0x30,0x30,1);
  caseDef[9].attachmentSize.m_data[1] = 1;
  caseDef[9].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[9].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[9].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[10].renderSize.m_data + 1),0x27,0x29,1);
  caseDef[10].attachmentSize.m_data[1] = 1;
  caseDef[10].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[10].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[10].multisample,0x13,0x1b,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0xb].renderSize.m_data + 1),0x20,0x20,1);
  caseDef[0xb].attachmentSize.m_data[1] = 1;
  caseDef[0xb].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0xb].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0xb].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0xc].renderSize.m_data + 1),0x40,0x40,1);
  caseDef[0xc].attachmentSize.m_data[1] = 4;
  caseDef[0xc].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0xc].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0xc].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0xd].renderSize.m_data + 1),0x30,0x30,1);
  caseDef[0xd].attachmentSize.m_data[1] = 4;
  caseDef[0xd].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0xd].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0xd].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0xe].renderSize.m_data + 1),0x27,0x29,1);
  caseDef[0xe].attachmentSize.m_data[1] = 4;
  caseDef[0xe].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0xe].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0xe].multisample,0x13,0x1b,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0xf].renderSize.m_data + 1),0x20,0x20,1);
  caseDef[0xf].attachmentSize.m_data[1] = 4;
  caseDef[0xf].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0xf].numLayers = 3;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0xf].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x10].renderSize.m_data + 1),0x40,0x40,1);
  caseDef[0x10].attachmentSize.m_data[1] = 6;
  caseDef[0x10].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x10].numLayers = 3;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x10].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x11].renderSize.m_data + 1),0x30,0x30,1);
  caseDef[0x11].attachmentSize.m_data[1] = 6;
  caseDef[0x11].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x11].numLayers = 3;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x11].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x12].renderSize.m_data + 1),0x27,0x29,1);
  caseDef[0x12].attachmentSize.m_data[1] = 6;
  caseDef[0x12].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x12].numLayers = 3;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x12].multisample,0x13,0x1b,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x13].renderSize.m_data + 1),0x20,0x20,1);
  caseDef[0x13].attachmentSize.m_data[1] = 6;
  caseDef[0x13].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x13].numLayers = 6;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x13].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x14].renderSize.m_data + 1),0x40,0x40,1);
  caseDef[0x14].attachmentSize.m_data[1] = 0xc;
  caseDef[0x14].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x14].numLayers = 6;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x14].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x15].renderSize.m_data + 1),0x30,0x30,1);
  caseDef[0x15].attachmentSize.m_data[1] = 0xc;
  caseDef[0x15].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x15].numLayers = 6;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x15].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x16].renderSize.m_data + 1),0x27,0x29,1);
  caseDef[0x16].attachmentSize.m_data[1] = 0xc;
  caseDef[0x16].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x16].numLayers = 6;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x16].multisample,0x13,0x1b,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x17].renderSize.m_data + 1),0x20,0x20,1);
  caseDef[0x17].attachmentSize.m_data[1] = 0xc;
  caseDef[0x17].attachmentSize.m_data[2]._0_1_ = 0;
  caseDef[0x17].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x17].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x18].renderSize.m_data + 1),0x40,0x40,1);
  caseDef[0x18].attachmentSize.m_data[1] = 1;
  caseDef[0x18].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef[0x18].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x18].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x19].renderSize.m_data + 1),0x30,0x30,1);
  caseDef[0x19].attachmentSize.m_data[1] = 1;
  caseDef[0x19].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef[0x19].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x19].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x1a].renderSize.m_data + 1),0x27,0x29,1);
  caseDef[0x1a].attachmentSize.m_data[1] = 1;
  caseDef[0x1a].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef[0x1a].numLayers = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x1a].multisample,0x13,0x1b,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x1b].renderSize.m_data + 1),0x20,0x20,1);
  caseDef[0x1b].attachmentSize.m_data[1] = 1;
  caseDef[0x1b].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef[0x1b].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x1b].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x1c].renderSize.m_data + 1),0x40,0x40,1);
  caseDef[0x1c].attachmentSize.m_data[1] = 4;
  caseDef[0x1c].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef[0x1c].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x1c].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x1d].renderSize.m_data + 1),0x30,0x30,1);
  caseDef[0x1d].attachmentSize.m_data[1] = 4;
  caseDef[0x1d].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef[0x1d].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x1d].multisample,0x20,0x20,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x1e].renderSize.m_data + 1),0x27,0x29,1);
  caseDef[0x1e].attachmentSize.m_data[1] = 4;
  caseDef[0x1e].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef[0x1e].numLayers = 5;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&caseDef[0x1e].multisample,0x13,0x1b,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(caseDef[0x1f].renderSize.m_data + 1),0x20,0x20,1);
  caseDef[0x1f].attachmentSize.m_data[1] = 4;
  caseDef[0x1f].attachmentSize.m_data[2]._0_1_ = 1;
  caseDef_00 = extraout_RDX;
  for (local_49c = 0; local_49c < 0x20; local_49c = local_49c + 1) {
    pipeline::(anonymous_namespace)::getTestCaseString_abi_cxx11_
              (&local_4e0,(_anonymous_namespace_ *)(local_498 + (long)local_49c * 0x24),caseDef_00);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,__s,&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"",&local_519);
    CaseDef::CaseDef((CaseDef *)&local_540,(CaseDef_conflict1 *)(local_498 + (long)local_49c * 0x24)
                    );
    addFunctionCaseWithPrograms<vkt::pipeline::(anonymous_namespace)::CaseDef>
              (group,&local_4c0,&local_518,initColorPrograms,test,&local_540);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator(&local_519);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4e1);
    std::__cxx11::string::~string((string *)&local_4e0);
    caseDef_00 = extraout_RDX_00;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"no_attachments",&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"",&local_589);
  addFunctionCaseWithPrograms<bool>(group,&local_560,&local_588,initImagePrograms,testNoAtt,false);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"no_attachments_ms",&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"",&local_5d9);
  addFunctionCaseWithPrograms<bool>(group,&local_5b0,&local_5d8,initImagePrograms,testNoAtt,true);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  return;
}

Assistant:

void addAttachmentTestCasesWithFunctions (tcu::TestCaseGroup* group)
{

	// Add test cases for attachment strictly sizes larger than the framebuffer
	const CaseDef	caseDef[]	=
	{
		// Single-sample test cases
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(64, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(48, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(32, 1, 1),	IVec3(39, 1, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_1D,			IVec3(19, 1, 1),	IVec3(32, 1, 1),	1,		false },

		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(64, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(48, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(32, 1, 1),	IVec3(39, 1, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		IVec3(19, 1, 1),	IVec3(32, 1, 1),	4,		false },

		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	1,		false },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	1,		false },

		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(64, 64, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(48, 48, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(39, 41, 1),	4,		false },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(19, 27, 1),	IVec3(32, 32, 1),	4,		false },

		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	6,		false },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	6,		false },

		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(64, 64, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(48, 48, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(32, 32, 1),	IVec3(39, 41, 1),	6*2,	false },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	IVec3(19, 27, 1),	IVec3(32, 32, 1),	6*2,	false },

		// Multi-sample test cases
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(64, 64, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(48, 48, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(32, 32, 1),	IVec3(39, 41, 1),	1,		true },
		{ VK_IMAGE_VIEW_TYPE_2D,			IVec3(19, 27, 1),	IVec3(32, 32, 1),	1,		true },

		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(64, 64, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(48, 48, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(32, 32, 1),	IVec3(39, 41, 1),	4,		true },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		IVec3(19, 27, 1),	IVec3(32, 32, 1),	4,		true },
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(caseDef); ++sizeNdx)
		addFunctionCaseWithPrograms(group, getTestCaseString(caseDef[sizeNdx]).c_str(), "", initColorPrograms, test, caseDef[sizeNdx]);

	// Add tests for the case where there are no color attachments but the
	// fragment shader writes to an image via imageStore().
	addFunctionCaseWithPrograms(group, "no_attachments", "", initImagePrograms, testNoAtt, false);
	addFunctionCaseWithPrograms(group, "no_attachments_ms", "", initImagePrograms, testNoAtt, true);
}